

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O3

void __thiscall
ans_reorder_fold_encode<2U>::encode_symbol
          (ans_reorder_fold_encode<2U> *this,uint64_t *state,uint32_t sym,uint8_t **out_u8)

{
  ushort *puVar1;
  ushort uVar2;
  uint8_t *puVar3;
  pointer peVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar6 = (this->mapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[sym];
  iVar8 = 0;
  uVar10 = uVar6;
  if (0x1ff < uVar6) {
    do {
      puVar3 = *out_u8;
      uVar6 = uVar10 >> 8;
      iVar8 = iVar8 + 0x1fe;
      *out_u8 = puVar3 + 1;
      *puVar3 = (uint8_t)uVar10;
      bVar5 = 0x1ffff < uVar10;
      uVar10 = uVar6;
    } while (bVar5);
  }
  peVar4 = (this->table).
           super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = *state;
  uVar9 = (ulong)((iVar8 + uVar6 & 0xffff) << 4);
  puVar1 = (ushort *)((long)&peVar4->freq + uVar9);
  if (*(ulong *)((long)&peVar4->sym_upper_bound + uVar9) <= uVar7) {
    puVar3 = *out_u8;
    *(int *)puVar3 = (int)uVar7;
    uVar7 = uVar7 >> 0x20;
    *out_u8 = puVar3 + 4;
    *state = uVar7;
  }
  uVar2 = *puVar1;
  *state = (ulong)*(uint *)(puVar1 + 2) + uVar7 % (ulong)uVar2 + (uVar7 / uVar2) * this->frame_size;
  return;
}

Assistant:

void encode_symbol(uint64_t& state, uint32_t sym, uint8_t*& out_u8)
    {
        auto mapped_sym = ans_reorder_fold_mapping_and_exceptions<fidelity>(
            mapping[sym], out_u8);
        const auto& e = table[mapped_sym];
        if (state >= e.sym_upper_bound) {
            auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
            *out_ptr_u32 = state & 0xFFFFFFFF;
            out_u8 += sizeof(uint32_t);
            state = state >> constants::RADIX_LOG2;
        }
        state = ((state / e.freq) * frame_size) + (state % e.freq) + e.base;
    }